

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

int bf_hex_dump(bfile_t *bfile,FILE *file,uint n_bytes,uint unit_size)

{
  ulong uVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  ushort **ppuVar5;
  ulong uVar6;
  uint in_EDX;
  FILE *in_RSI;
  bfile_t *in_RDI;
  bool bVar7;
  size_t pad;
  uint32_t mask;
  uint32_t word;
  size_t num_bytes;
  size_t bytes_per_line;
  size_t bytes;
  uint j;
  uint i;
  bool_t eof;
  char format [256];
  char buffer [256];
  char ascii [256];
  char line [256];
  bfile_t *bfile_00;
  uint local_448;
  uint local_444;
  ulong local_440;
  ulong local_430;
  uint local_424;
  uint local_420;
  char local_418 [256];
  char local_318 [256];
  char local_218 [256];
  bfile_t local_118 [3];
  uint local_18;
  FILE *local_10;
  bfile_t *local_8;
  
  local_440 = (ulong)in_EDX;
  local_18 = 3;
  local_118[0].flags._0_1_ = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar3 = bf_get_remaining_length(in_RDI);
  bVar7 = sVar3 < local_440;
  if (bVar7) {
    local_440 = bf_get_remaining_length(local_8);
  }
  uVar4 = 0x10 - 0x10U % (ulong)local_18;
  for (local_430 = 0; local_430 < local_440; local_430 = local_420 + local_430) {
    bfile_00 = local_118;
    sVar3 = bf_get_position(local_8);
    sprintf((char *)bfile_00,"0x%06x:  ",sVar3 & 0xffffffff);
    local_420 = 0;
    while (local_420 < uVar4 && local_430 + local_420 < local_440) {
      local_444 = 0;
      local_448 = 0;
      for (local_424 = 0; local_424 < local_18 && local_430 + local_420 < local_440;
          local_424 = local_424 + 1) {
        local_448 = local_448 * 0x100 + 0xff;
        bVar2 = bf_get_uint8(bfile_00);
        local_444 = (uint)bVar2 + local_444 * 0x100;
        local_218[local_420] = '.';
        ppuVar5 = __ctype_b_loc();
        if (((*ppuVar5)[(int)(local_444 & 0xff)] & 0x4000) != 0) {
          local_218[local_420] = (char)local_444;
        }
        local_420 = local_420 + 1;
      }
      sprintf(local_418,"%%0%dx ",(ulong)(local_424 << 1));
      sprintf(local_318,local_418,(ulong)(local_444 & local_448));
      strcat((char *)local_118,local_318);
    }
    if (local_420 < uVar4) {
      uVar6 = (ulong)local_18;
      uVar1 = (ulong)local_18;
      for (local_424 = 0;
          (ulong)local_424 < (((uVar4 - local_420) + uVar6) / uVar1 - 1) + (uVar4 - local_420) * 2;
          local_424 = local_424 + 1) {
        strcat((char *)local_118," ");
      }
    }
    local_218[local_420] = '\0';
    strcat((char *)local_118," \"");
    strcat((char *)local_118,local_218);
    strcat((char *)local_118,"\"");
    fprintf(local_10,"%s\n",local_118);
  }
  if (bVar7) {
    sVar3 = bf_get_position(local_8);
    fprintf(local_10,"0x%06x:  [reached end of file]\n",sVar3 & 0xffffffff);
  }
  return (int)local_440;
}

Assistant:

int
bf_hex_dump(
    bfile_t * bfile,
    FILE * file,
    unsigned int n_bytes,
    unsigned int unit_size )
{
    char line[ 256 ];
    char ascii[ 256 ];
    char buffer[ 256 ];
    char format[ 256 ];
    bool_t eof;

    unsigned int i, j;
    size_t bytes, bytes_per_line, num_bytes = n_bytes;

    unit_size = 3;

    line[0] = '\0';
    eof = FALSE;

    if ( bf_get_remaining_length( bfile ) < num_bytes ) {
        num_bytes = bf_get_remaining_length( bfile );
        eof = TRUE;
    }

    bytes_per_line = 16;
    bytes_per_line -= (bytes_per_line%unit_size);

    bytes = 0;
    while ( bytes < num_bytes ) {
        sprintf( line, "0x%06x:  ", (unsigned int)bf_get_position( bfile ) );
        i = 0;
        while ( (i < bytes_per_line) && ((bytes + i) < num_bytes) ) {
            uint32_t word;
            uint32_t mask;
            word = 0; mask = 0;
            for ( j = 0; j < unit_size && (bytes + i) < num_bytes; j++ ) {
                word <<= 8;
                mask <<= 8; mask += 0xff;
                word += bf_get_uint8( bfile );
                ascii[i] = '.';
                if ( isprint( word & 0xff ) )
                    ascii[i] = word & 0xff;
                i++;
            }
            sprintf( format, "%%0%dx ", j * 2 );
            sprintf( buffer, format, (word & mask) );
            strcat( line, buffer );
        }
        if ( i < bytes_per_line ) {
            size_t pad;
            pad = ((bytes_per_line - i + unit_size) / unit_size) - 1 +
                  2 * (bytes_per_line - i);
            for ( j = 0; j < pad; j++ ) 
                strcat( line, " " );
        }
        ascii[i] = '\0';
        strcat( line, " \"" );
        strcat( line, ascii );
        strcat( line, "\"" );
        fprintf( file, "%s\n", line );
        bytes += i;
    }
    if ( eof != FALSE )
        fprintf( file, "0x%06x:  [reached end of file]\n",
            (unsigned int)bf_get_position( bfile ) );
    
    return (int)num_bytes;
}